

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Node * __thiscall Parser::compound_statement(Parser *this)

{
  token_type tVar1;
  Node *this_00;
  Node *pNVar2;
  Node *this_01;
  Node *operand1;
  char *__end;
  string local_70;
  string local_50;
  
  Lexer::next_token(this->lex);
  this_00 = (Node *)operator_new(0x48);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  Node::Node(this_00,SEQ,(Node *)0x0,(Node *)0x0,&local_50,(Node *)0x0,(Node *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  tVar1 = Lexer::current_token_type(this->lex);
  if (tVar1 != RBRACE) {
    pNVar2 = statement(this);
    this_00->operand1 = pNVar2;
  }
  tVar1 = Lexer::current_token_type(this->lex);
  if (tVar1 != RBRACE) {
    pNVar2 = this_00;
    do {
      this_01 = (Node *)operator_new(0x48);
      operand1 = statement(this);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
      Node::Node(this_01,SEQ,operand1,(Node *)0x0,&local_70,(Node *)0x0,(Node *)0x0);
      pNVar2->operand2 = this_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
        this_01 = pNVar2->operand2;
      }
      pNVar2 = this_01;
      tVar1 = Lexer::current_token_type(this->lex);
    } while (tVar1 != RBRACE);
  }
  Lexer::next_token(this->lex);
  return this_00;
}

Assistant:

Node* Parser::compound_statement()
{
	lex->next_token();

	Node* statement_node = new Node(node_type::SEQ);
	Node* last_node = statement_node;
	if (!tryEat(token_type::RBRACE)) last_node->operand1 = statement();

	while (!tryEat(token_type::RBRACE)) {

		last_node->operand2 = new Node(node_type::SEQ, statement());

		last_node = last_node->operand2;
	}
	lex->next_token();
	
	return statement_node;
}